

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O0

int spotcheckall(void)

{
  int iVar1;
  float f;
  uint i;
  int count;
  undefined4 local_8;
  
  f = 0.0;
  for (local_8 = 0; local_8 < 0x90; local_8 = local_8 + 2) {
    iVar1 = spotcheck(i,f);
    f = (float)(iVar1 + (int)f);
  }
  return (int)f;
}

Assistant:

int spotcheckall()
{
    static float t[] = {
        1, 5.960464e-08,
        3, 1.788139e-07,
        8, 4.768372e-07,
        16, 9.536743e-07,
        33, 1.966953e-06,
        83, 4.947186e-06,
        167, 9.953976e-06,
        335, 1.996756e-05,
        838, 4.994869e-05,
        1677, 9.995699e-05,
        2701, 0.000199914,
        4120, 0.0004997253,
        5144, 0.0009994507,
        6168, 0.001998901,
        7454, 0.004997253,
        8478, 0.009994507,
        9502, 0.01998901,
        10854, 0.04998779,
        11878, 0.09997559,
        12902, 0.1999512,
        14336, 0.5,
        15360, 1,
        16384, 2,
        17664, 5,
        18688, 10,
        19712, 20,
        21056, 50,
        22080, 100,
        23104, 200,
        24528, 500,
        25552, 1000,
        26576, 2000,
        27874, 5000,
        28898, 10000,
        29922, 20000,
        31258, 49984,
        32769, -5.960464e-08,
        32771, -1.788139e-07,
        32776, -4.768372e-07,
        32784, -9.536743e-07,
        32801, -1.966953e-06,
        32851, -4.947186e-06,
        32935, -9.953976e-06,
        33103, -1.996756e-05,
        33606, -4.994869e-05,
        34445, -9.995699e-05,
        35469, -0.000199914,
        36888, -0.0004997253,
        37912, -0.0009994507,
        38936, -0.001998901,
        40222, -0.004997253,
        41246, -0.009994507,
        42270, -0.01998901,
        43622, -0.04998779,
        44646, -0.09997559,
        45670, -0.1999512,
        47104, -0.5,
        48128, -1,
        49152, -2,
        50432, -5,
        51456, -10,
        52480, -20,
        53824, -50,
        54848, -100,
        55872, -200,
        57296, -500,
        58320, -1000,
        59344, -2000,
        60642, -5000,
        61666, -10000,
        62690, -20000,
        64026, -49984,
    };

    int count = 0;
    for (unsigned int i = 0; i < (sizeof(t)/sizeof(float)); i+=2) 
        count += spotcheck(int(t[i]), t[i+1]);
    return count;
}